

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jint Java_beagle_BeagleJNIWrapper_calculateCrossProductDifferentials
               (JNIEnv *env,jobject obj,jint instance,jintArray postBufferIndices,
               jintArray preBufferIndices,jintArray categoryRatesIndices,
               jintArray categoryWeightsIndices,jdoubleArray edgeLengths,jint count,
               jdoubleArray outSumDerivatives,jdoubleArray outSumSquaredDerivatives)

{
  jint jVar1;
  jdouble *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  jdouble *pjVar7;
  jdouble *local_58;
  
  if (outSumDerivatives == (jdoubleArray)0x0) {
    pjVar2 = (jdouble *)0x0;
  }
  else {
    pjVar2 = (*env->functions->GetDoubleArrayElements)(env,outSumDerivatives,(jboolean *)0x0);
  }
  if (outSumSquaredDerivatives == (jdoubleArray)0x0) {
    local_58 = (jdouble *)0x0;
  }
  else {
    local_58 = (*env->functions->GetDoubleArrayElements)
                         (env,outSumSquaredDerivatives,(jboolean *)0x0);
  }
  pjVar3 = (*env->functions->GetIntArrayElements)(env,postBufferIndices,(jboolean *)0x0);
  pjVar4 = (*env->functions->GetIntArrayElements)(env,preBufferIndices,(jboolean *)0x0);
  pjVar5 = (*env->functions->GetIntArrayElements)(env,categoryRatesIndices,(jboolean *)0x0);
  pjVar6 = (*env->functions->GetIntArrayElements)(env,categoryWeightsIndices,(jboolean *)0x0);
  pjVar7 = (*env->functions->GetDoubleArrayElements)(env,edgeLengths,(jboolean *)0x0);
  jVar1 = beagleCalculateCrossProductDerivative
                    (instance,pjVar3,pjVar4,pjVar5,pjVar6,pjVar7,count,pjVar2,local_58);
  (*env->functions->ReleaseIntArrayElements)(env,postBufferIndices,pjVar3,2);
  (*env->functions->ReleaseIntArrayElements)(env,preBufferIndices,pjVar4,2);
  (*env->functions->ReleaseIntArrayElements)(env,categoryRatesIndices,pjVar5,2);
  (*env->functions->ReleaseIntArrayElements)(env,categoryWeightsIndices,pjVar6,2);
  (*env->functions->ReleaseDoubleArrayElements)(env,edgeLengths,pjVar7,2);
  if (outSumDerivatives != (jdoubleArray)0x0) {
    (*env->functions->ReleaseDoubleArrayElements)(env,outSumDerivatives,pjVar2,0);
  }
  if (outSumSquaredDerivatives != (jdoubleArray)0x0) {
    (*env->functions->ReleaseDoubleArrayElements)(env,outSumSquaredDerivatives,local_58,0);
  }
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateCrossProductDifferentials
  (JNIEnv *env, jobject obj, jint instance,
		jintArray postBufferIndices,
		jintArray preBufferIndices,
		jintArray categoryRatesIndices,
		jintArray categoryWeightsIndices,
		jdoubleArray edgeLengths,
		jint count,
		jdoubleArray outSumDerivatives,
		jdoubleArray outSumSquaredDerivatives) {

    jdouble* jOutSumDerivatives = outSumDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumDerivatives, NULL);

    jdouble* jOutSumSquaredDerivatives = outSumSquaredDerivatives == NULL ?
            NULL : env->GetDoubleArrayElements(outSumSquaredDerivatives, NULL);

    jint *jPostBufferIndices = env->GetIntArrayElements(postBufferIndices, NULL);
    jint *jPreBufferIndices  = env->GetIntArrayElements(preBufferIndices, NULL);

    jint *jCategoryRatesIndices = env->GetIntArrayElements(categoryRatesIndices, NULL);
    jint *jCategoryWeightsIndices = env->GetIntArrayElements(categoryWeightsIndices, NULL);

    jdouble* jEdgeLengths = env->GetDoubleArrayElements(edgeLengths, NULL);

    jint errCode = beagleCalculateCrossProductDerivative(instance, (int*)jPostBufferIndices, (int*)jPreBufferIndices,
                                                         (int*)jCategoryRatesIndices, (int*)jCategoryWeightsIndices,
                                                         (double*)jEdgeLengths, count,
                                                         jOutSumDerivatives, jOutSumSquaredDerivatives);

    env->ReleaseIntArrayElements(postBufferIndices, jPostBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(preBufferIndices, jPreBufferIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(categoryRatesIndices, jCategoryRatesIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(categoryWeightsIndices, jCategoryWeightsIndices, JNI_ABORT);
    env->ReleaseDoubleArrayElements(edgeLengths, jEdgeLengths, JNI_ABORT);

    if (outSumDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumDerivatives, jOutSumDerivatives, 0);
    }

    if (outSumSquaredDerivatives != NULL) {
        env->ReleaseDoubleArrayElements(outSumSquaredDerivatives, jOutSumSquaredDerivatives, 0);
    }

    return errCode;


}